

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.cpp
# Opt level: O3

void __thiscall mjs::gc_heap::allocation_context::run_destructors(allocation_context *this)

{
  slot_allocation_header sVar1;
  uint uVar2;
  uint uVar3;
  
  uVar3 = this->start_;
  uVar2 = this->next_free_;
  if (uVar3 < uVar2) {
    do {
      sVar1 = this->storage_[uVar3].allocation;
      if (sVar1.type >> 1 < 0x7fffffff) {
        if (gc_type_info::num_types_ <= sVar1.type) {
          __assert_fail("index < num_types_",
                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.h"
                        ,0x44,"static const gc_type_info &mjs::gc_type_info::from_index(uint32_t)");
        }
        if ((code *)**(undefined8 **)(gc_type_info::types_ + ((ulong)sVar1 >> 0x20) * 8) !=
            (code *)0x0) {
          (*(code *)**(undefined8 **)(gc_type_info::types_ + ((ulong)sVar1 >> 0x20) * 8))
                    (this->storage_ + (ulong)uVar3 + 1);
          uVar2 = this->next_free_;
        }
      }
      uVar3 = uVar3 + sVar1.size;
    } while (uVar3 < uVar2);
    uVar3 = this->start_;
  }
  this->next_free_ = uVar3;
  return;
}

Assistant:

void gc_heap::allocation_context::run_destructors() {
    for (uint32_t pos = start_; pos < next_free_;) {
        const auto a = storage_[pos].allocation;
        if (a.active()) {
            a.type_info().destroy(&storage_[pos+1]);
        }
        pos += a.size;
    }

    next_free_ = start_;
}